

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_blitter.cpp
# Opt level: O3

void __thiscall QBlitterPaintEngine::fillRect(QBlitterPaintEngine *this,QRectF *rect,QColor *color)

{
  uint uVar1;
  uint uVar2;
  QBlitterPaintEnginePrivate *this_00;
  QRasterBuffer *this_01;
  bool bVar3;
  int iVar4;
  QBlittable *this_02;
  undefined4 extraout_var;
  
  this_00 = (QBlitterPaintEnginePrivate *)
            (this->super_QRasterPaintEngine).super_QPaintEngineEx.super_QPaintEngine.d_ptr.d;
  uVar1 = (this_00->caps).capabillitiesState;
  if ((uVar1 != 0) &&
     ((uVar2 = (this_00->caps).alphaFillRectMask, (uVar2 & uVar1) == 0 || ((uVar1 & ~uVar2) != 0))))
  {
    uVar2 = (this_00->caps).fillRectMask;
    if (((uVar2 & uVar1) != 0) && ((uVar1 & ~uVar2) == 0)) {
      iVar4 = QColor::alpha(color);
      if (iVar4 == 0xff) {
        bVar3 = false;
        goto LAB_003b3ffe;
      }
    }
    this_02 = QBlittablePlatformPixmap::blittable(this_00->pmData);
    bVar3 = QBlittable::isLocked(this_02);
    if (!bVar3) {
      this_01 = (this_00->super_QRasterPaintEnginePrivate).rasterBuffer.d;
      iVar4 = (*(this_00->pmData->super_QPlatformPixmap)._vptr_QPlatformPixmap[0x16])();
      QRasterBuffer::prepare(this_01,(QImage *)CONCAT44(extraout_var,iVar4));
    }
    QRasterPaintEngine::fillRect(&this->super_QRasterPaintEngine,rect,color);
    return;
  }
  bVar3 = true;
LAB_003b3ffe:
  QBlitterPaintEnginePrivate::fillRect(this_00,rect,color,bVar3);
  return;
}

Assistant:

void QBlitterPaintEngine::fillRect(const QRectF &rect, const QColor &color)
{
    Q_D(QBlitterPaintEngine);
    if (d->caps.canBlitterAlphaFillRect()) {
        d->fillRect(rect, color, true);
    } else if (d->caps.canBlitterFillRect() && color.alpha() == 0xff) {
        d->fillRect(rect, color, false);
    } else {
        d->lock();
        d->pmData->markRasterOverlay(rect);
        QRasterPaintEngine::fillRect(rect, color);
    }
}